

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O2

uint q_PSK_client_callback
               (SSL *ssl,char *hint,char *identity,uint max_identity_len,uchar *psk,uint max_psk_len
               )

{
  uint uVar1;
  void *pvVar2;
  
  pvVar2 = q_SSL_get_ex_data(ssl,QTlsBackendOpenSSL::s_indexForSSLExtraData);
  if (pvVar2 != (void *)0x0) {
    uVar1 = QDtlsPrivateOpenSSL::pskClientCallback
                      (*(QDtlsPrivateOpenSSL **)((long)pvVar2 + 0x88),hint,identity,max_identity_len
                       ,psk,max_psk_len);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned q_PSK_client_callback(SSL *ssl, const char *hint, char *identity,
                                          unsigned max_identity_len, unsigned char *psk,
                                          unsigned max_psk_len)
{
    auto *dtls = static_cast<dtlsopenssl::DtlsState *>(q_SSL_get_ex_data(ssl,
                                                       QTlsBackendOpenSSL::s_indexForSSLExtraData));
    if (!dtls)
        return 0;

    Q_ASSERT(dtls->dtlsPrivate);
    return dtls->dtlsPrivate->pskClientCallback(hint, identity, max_identity_len, psk, max_psk_len);
}